

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::GetUnusedArguments(CommandLineArguments *this,int *argc,char ***argv)

{
  Internal *pIVar1;
  long lVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pSVar7;
  bool bVar8;
  
  pIVar1 = this->Internals;
  lVar2 = (long)(pIVar1->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pIVar1->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  ppcVar3 = (char **)operator_new__(-(ulong)(lVar2 + 1U >> 0x3d != 0) | lVar2 * 8 + 8U);
  pcVar4 = (char *)operator_new__((pIVar1->Argv0).super_string._M_string_length + 1);
  *ppcVar3 = pcVar4;
  strcpy(pcVar4,(pIVar1->Argv0).super_string._M_dataplus._M_p);
  pSVar7 = (pIVar1->UnusedArguments).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pIVar1->UnusedArguments).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
      super__Vector_impl_data._M_finish == pSVar7) {
    uVar6 = 1;
  }
  else {
    lVar2 = 8;
    uVar5 = 1;
    do {
      pcVar4 = (char *)operator_new__(*(long *)((long)&(pSVar7->super_string)._M_dataplus._M_p +
                                               lVar2) + 1);
      ppcVar3[uVar5] = pcVar4;
      strcpy(pcVar4,*(char **)((long)pSVar7 + lVar2 + -8));
      uVar6 = uVar5 + 1;
      pSVar7 = (pIVar1->UnusedArguments).super_vector<cmsys::String,_std::allocator<cmsys::String>_>
               .super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
      bVar8 = uVar5 < (ulong)((long)(pIVar1->UnusedArguments).
                                    super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                                    super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 5);
      uVar5 = uVar6;
    } while (bVar8);
  }
  *argc = (int)uVar6;
  *argv = ppcVar3;
  return;
}

Assistant:

void CommandLineArguments::GetUnusedArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size =
    this->Internals->UnusedArguments.size() + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[size];
  args[0] = new char[this->Internals->Argv0.size() + 1];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for (cc = 0; cc < this->Internals->UnusedArguments.size(); cc++) {
    kwsys::String& str = this->Internals->UnusedArguments[cc];
    args[cnt] = new char[str.size() + 1];
    strcpy(args[cnt], str.c_str());
    cnt++;
  }
  *argc = cnt;
  *argv = args;
}